

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

bool __thiscall jhu::thrax::AlignedSentencePair::consistent(AlignedSentencePair *this)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  AlignedSentencePair *this_local;
  
  __first = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin
                      (&this->alignment);
  __last = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end(&this->alignment)
  ;
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<jhu::thrax::Point_const*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,jhu::thrax::AlignedSentencePair::consistent()const::_lambda(auto:1)_1_>
                    ((__normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                      )__last._M_current,(anon_class_8_1_8991fb9c)this);
  return bVar1;
}

Assistant:

bool consistent() const {
    return std::all_of(
        alignment.begin(),
        alignment.end(),
        [this](auto p) {
          return p.src >= 0
              && p.tgt >= 0
              && p.src < static_cast<IndexType>(src.size())
              && p.tgt < static_cast<IndexType>(tgt.size());
        });
  }